

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testchar.c
# Opt level: O0

char * convert(xmlCharEncodingHandlerPtr handler,char *utf8,int size,int *outSize)

{
  undefined8 uVar1;
  long lVar2;
  char *pcVar3;
  char *ret;
  xmlBufferPtr out;
  xmlBufferPtr in;
  int *outSize_local;
  int size_local;
  char *utf8_local;
  xmlCharEncodingHandlerPtr handler_local;
  
  uVar1 = xmlBufferCreate();
  xmlBufferAdd(uVar1,utf8,size);
  lVar2 = xmlBufferCreate();
  xmlCharEncOutFunc(handler,lVar2,uVar1);
  if (outSize != (int *)0x0) {
    *outSize = *(int *)(lVar2 + 8);
  }
  pcVar3 = (char *)xmlBufferDetach(lVar2);
  xmlBufferFree(lVar2);
  xmlBufferFree(uVar1);
  return pcVar3;
}

Assistant:

static char *
convert(xmlCharEncodingHandlerPtr handler, const char *utf8, int size,
        int *outSize) {
    xmlBufferPtr in, out;
    char *ret;

    in = xmlBufferCreate();
    xmlBufferAdd(in, BAD_CAST utf8, size);
    out = xmlBufferCreate();
    xmlCharEncOutFunc(handler, out, in);

    if (outSize)
        *outSize = out->use;
    ret = (char *) xmlBufferDetach(out);

    xmlBufferFree(out);
    xmlBufferFree(in);
    return(ret);
}